

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::set_allocated_scene
          (VisionFeaturePrint *this,VisionFeaturePrint_Scene *scene)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  VisionFeaturePrint_Scene *scene_local;
  VisionFeaturePrint *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_VisionFeaturePrintType(this);
  if (scene != (VisionFeaturePrint_Scene *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>::
         GetOwningArena(scene);
    message_arena = (Arena *)scene;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                              (message_arena_00,scene,submessage_arena_00);
    }
    set_has_scene(this);
    (this->VisionFeaturePrintType_).scene_ = (VisionFeaturePrint_Scene *)message_arena;
  }
  return;
}

Assistant:

void VisionFeaturePrint::set_allocated_scene(::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene* scene) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_VisionFeaturePrintType();
  if (scene) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>::GetOwningArena(scene);
    if (message_arena != submessage_arena) {
      scene = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, scene, submessage_arena);
    }
    set_has_scene();
    VisionFeaturePrintType_.scene_ = scene;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CoreMLModels.VisionFeaturePrint.scene)
}